

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O2

void wasm::Debug::dumpDWARF(Module *wasm)

{
  pointer pCVar1;
  bool bVar2;
  ostream *poVar3;
  raw_ostream *prVar4;
  CustomSection *section;
  pointer str;
  IString local_80;
  undefined1 local_70 [8];
  BinaryenDWARFInfo info;
  
  BinaryenDWARFInfo::BinaryenDWARFInfo((BinaryenDWARFInfo *)local_70,wasm);
  std::operator<<((ostream *)&std::cout,"DWARF debug info\n");
  std::operator<<((ostream *)&std::cout,"================\n\n");
  pCVar1 = (wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (str = (wasm->customSections).
             super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
             super__Vector_impl_data._M_start; str != pCVar1; str = str + 1) {
    IString::IString(&local_80,&str->name);
    bVar2 = IString::startsWith<8>(&local_80,(char (*) [8])".debug_");
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Contains section ");
      poVar3 = std::operator<<(poVar3,(string *)str);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," bytes)\n");
    }
  }
  prVar4 = llvm::outs();
  info.context._M_t.
  super___uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>._M_t.
  super__Tuple_impl<0UL,_llvm::DWARFContext_*,_std::default_delete<llvm::DWARFContext>_>.
  super__Head_base<0UL,_llvm::DWARFContext_*,_false>._M_head_impl =
       (__uniq_ptr_data<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>,_true,_true>)
       (__uniq_ptr_impl<llvm::DWARFContext,_std::default_delete<llvm::DWARFContext>_>)
       0xffffffffffffffff;
  (**(code **)(*(long *)info.sections._24_8_ + 0x10))(info.sections._24_8_,prVar4);
  BinaryenDWARFInfo::~BinaryenDWARFInfo((BinaryenDWARFInfo *)local_70);
  return;
}

Assistant:

void dumpDWARF(const Module& wasm) {
  BinaryenDWARFInfo info(wasm);
  std::cout << "DWARF debug info\n";
  std::cout << "================\n\n";
  for (auto& section : wasm.customSections) {
    if (Name(section.name).startsWith(".debug_")) {
      std::cout << "Contains section " << section.name << " ("
                << section.data.size() << " bytes)\n";
    }
  }
  llvm::DIDumpOptions options;
  options.DumpType = llvm::DIDT_All;
  options.ShowChildren = true;
  options.Verbose = true;
  info.context->dump(llvm::outs(), options);
}